

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O1

Gia_Man_t *
Bmc_BmciPart(Gia_Man_t *pNew,Vec_Int_t *vSatMap,Vec_Int_t *vMiters,Vec_Int_t *vPartMap,
            Vec_Int_t *vCopies)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *__s;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int *piVar7;
  Gia_Man_t *pPart;
  size_t sVar8;
  char *__dest;
  Gia_Obj_t *pFanout;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  
  uVar1 = pNew->nObjs;
  if (vCopies->nCap < (int)uVar1) {
    if (vCopies->pArray == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar7 = (int *)realloc(vCopies->pArray,(long)(int)uVar1 << 2);
    }
    vCopies->pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_005690cc;
    vCopies->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(vCopies->pArray,0,(ulong)uVar1 * 4);
  }
  vCopies->nSize = uVar1;
  iVar2 = pNew->nObjs;
  if (iVar2 <= vSatMap->nSize) goto LAB_00568d93;
  iVar3 = vSatMap->nCap;
  iVar10 = iVar3 * 2;
  if (iVar10 < iVar2) {
    if (iVar3 < iVar2) {
      if (vSatMap->pArray == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar2 << 2);
      }
      else {
        piVar7 = (int *)realloc(vSatMap->pArray,(long)iVar2 << 2);
      }
      vSatMap->pArray = piVar7;
      iVar10 = iVar2;
LAB_00568d59:
      if (piVar7 == (int *)0x0) {
LAB_005690cc:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vSatMap->nCap = iVar10;
    }
  }
  else if (iVar3 < iVar10 && iVar3 < iVar2) {
    if (vSatMap->pArray == (int *)0x0) {
      piVar7 = (int *)malloc((long)iVar3 << 3);
    }
    else {
      piVar7 = (int *)realloc(vSatMap->pArray,(long)iVar3 << 3);
    }
    vSatMap->pArray = piVar7;
    goto LAB_00568d59;
  }
  uVar1 = vSatMap->nSize;
  if ((int)uVar1 < iVar2) {
    memset(vSatMap->pArray + (int)uVar1,0xff,(ulong)(~uVar1 + iVar2) * 4 + 4);
  }
  vSatMap->nSize = iVar2;
LAB_00568d93:
  pPart = Gia_ManStart(1000);
  __s = pNew->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
  }
  pPart->pName = __dest;
  vPartMap->nSize = 0;
  Vec_IntPush(vPartMap,0);
  if (0 < vMiters->nSize) {
    lVar12 = 0;
    do {
      uVar1 = vMiters->pArray[lVar12];
      if (uVar1 != 0xffffffff) {
        if ((int)uVar1 < 2) {
          __assert_fail("iLit >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                        ,0x9b,
                        "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        uVar6 = Bmc_BmciPart_rec(pNew,vSatMap,uVar1 >> 1,pPart,vPartMap,vCopies);
        if ((int)uVar6 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar13 = uVar6 >> 1;
        if (pPart->nObjs <= (int)uVar13) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pPart->pObjs + uVar13) & 0x1fffffff) != 0 &&
            (int)*(uint *)(pPart->pObjs + uVar13) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pFanout = Gia_ManAppendObj(pPart);
        uVar4 = *(ulong *)pFanout;
        *(ulong *)pFanout = uVar4 | 0x80000000;
        pGVar5 = pPart->pObjs;
        if ((pFanout < pGVar5) || (pGVar5 + pPart->nObjs <= pFanout)) {
LAB_00568ff3:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar9 = (ulong)(((uint)((int)pFanout - (int)pGVar5) >> 2) * -0x55555555 - uVar13 &
                       0x1fffffff);
        uVar11 = (ulong)(((uVar6 ^ uVar1) & 1) << 0x1d);
        *(ulong *)pFanout = uVar11 | uVar4 & 0xffffffffc0000000 | 0x80000000 | uVar9;
        *(ulong *)pFanout =
             uVar11 | uVar4 & 0xe0000000c0000000 | 0x80000000 | uVar9 |
             (ulong)(pPart->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar5 = pPart->pObjs;
        if ((pFanout < pGVar5) || (pGVar5 + pPart->nObjs <= pFanout)) goto LAB_00568ff3;
        Vec_IntPush(pPart->vCos,(int)((ulong)((long)pFanout - (long)pGVar5) >> 2) * -0x55555555);
        if (pPart->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(pPart,pFanout + -(ulong)((uint)*(undefined8 *)pFanout & 0x1fffffff),
                           pFanout);
        }
        if ((pFanout < pPart->pObjs) || (pPart->pObjs + pPart->nObjs <= pFanout)) goto LAB_00568ff3;
        Vec_IntPush(vPartMap,-1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < vMiters->nSize);
  }
  if (pPart->vCos->nSize <= pPart->nRegs) {
    __assert_fail("Gia_ManPoNum(pPart) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0xa0,
                  "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (vPartMap->nSize == pPart->nObjs) {
    return pPart;
  }
  __assert_fail("Vec_IntSize(vPartMap) == Gia_ManObjNum(pPart)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                ,0xa1,
                "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

Gia_Man_t * Bmc_BmciPart( Gia_Man_t * pNew, Vec_Int_t * vSatMap, Vec_Int_t * vMiters, Vec_Int_t * vPartMap, Vec_Int_t * vCopies )
{
    Gia_Man_t * pPart;
    int i, iLit, iLitPart;
    Vec_IntFill( vCopies, Gia_ManObjNum(pNew), 0 );
    Vec_IntFillExtra( vSatMap, Gia_ManObjNum(pNew), -1 );
    pPart = Gia_ManStart( 1000 );
    pPart->pName = Abc_UtilStrsav( pNew->pName );
    Vec_IntClear( vPartMap );
    Vec_IntPush( vPartMap, 0 );
    Vec_IntForEachEntry( vMiters, iLit, i )
    {
        if ( iLit == -1 )
            continue;
        assert( iLit >= 2 );
        iLitPart = Bmc_BmciPart_rec( pNew, vSatMap, Abc_Lit2Var(iLit), pPart, vPartMap, vCopies );
        Gia_ManAppendCo( pPart, Abc_LitNotCond(iLitPart, Abc_LitIsCompl(iLit)) );
        Vec_IntPush( vPartMap, -1 );
    }
    assert( Gia_ManPoNum(pPart) > 0 );
    assert( Vec_IntSize(vPartMap) == Gia_ManObjNum(pPart) );
    return pPart;
}